

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O3

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnCatchExpr
          (BinaryReaderInterp *this,Index tag_index)

{
  uint uVar1;
  int iVar2;
  pointer pLVar3;
  pointer pLVar4;
  pointer pHVar5;
  pointer pLVar6;
  Result RVar7;
  Enum EVar8;
  Offset OVar9;
  long lVar10;
  Location loc;
  Location loc_1;
  Location local_b8;
  Location local_98;
  Var local_78;
  
  local_b8.field_1.field_0.last_column = 0;
  local_b8.filename._M_len = (this->filename_)._M_len;
  local_b8.filename._M_str = (this->filename_)._M_str;
  local_b8.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
       ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  local_98.field_1.field_0.last_column = 0;
  local_98.filename._M_len = (this->filename_)._M_len;
  local_98.filename._M_str = (this->filename_)._M_str;
  local_98.field_1.field_1.offset = local_b8.field_1.field_1.offset;
  Var::Var(&local_78,tag_index,&local_98);
  RVar7 = SharedValidator::OnCatch(&this->validator_,&local_b8,&local_78,false);
  Var::~Var(&local_78);
  EVar8 = Error;
  if (RVar7.enum_ != Error) {
    pLVar3 = (this->label_stack_).
             super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pLVar4 = (this->label_stack_).
             super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    lVar10 = (long)pLVar4 - (long)pLVar3;
    if (lVar10 == 0) {
      __assert_fail("depth < label_stack_.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/interp/binary-reader-interp.cc"
                    ,0x180,
                    "Label *wabt::interp::(anonymous namespace)::BinaryReaderInterp::GetLabel(Index)"
                   );
    }
    uVar1 = pLVar4[-1].handler_desc_index;
    pHVar5 = (this->func_->handlers).
             super__Vector_base<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pHVar5[uVar1].kind = Catch;
    if (pLVar4[-1].kind == Block) {
      Istream::EmitCatchDrop(this->istream_,1);
    }
    iVar2 = *(int *)((long)pLVar3 + lVar10 + -0xc);
    Istream::Emit(this->istream_,Br);
    if (iVar2 != -1) {
      __assert_fail("offset == Istream::kInvalidOffset",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/interp/binary-reader-interp.cc"
                    ,0x606,
                    "virtual Result wabt::interp::(anonymous namespace)::BinaryReaderInterp::OnCatchExpr(Index)"
                   );
    }
    pLVar4 = (this->label_stack_).
             super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pLVar6 = (this->label_stack_).
             super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
             ._M_impl.super__Vector_impl_data._M_start;
    OVar9 = Istream::end(this->istream_);
    FixupMap::Append(&this->depth_fixups_,(int)((ulong)((long)pLVar4 - (long)pLVar6) >> 4) - 1,OVar9
                    );
    Istream::Emit(this->istream_,0xffffffff);
    if (pHVar5[uVar1].try_end_offset == 0xffffffff) {
      OVar9 = Istream::end(this->istream_);
      pHVar5[uVar1].try_end_offset = OVar9;
    }
    *(undefined4 *)((long)pLVar3 + lVar10 + -0x10) = 0;
    local_b8.filename._M_len = CONCAT44(local_b8.filename._M_len._4_4_,tag_index);
    OVar9 = Istream::end(this->istream_);
    local_b8.filename._M_len = CONCAT44(OVar9,(undefined4)local_b8.filename._M_len);
    std::vector<wabt::interp::CatchDesc,_std::allocator<wabt::interp::CatchDesc>_>::
    emplace_back<wabt::interp::CatchDesc>(&pHVar5[uVar1].catches,(CatchDesc *)&local_b8);
    EVar8 = Ok;
  }
  return (Result)EVar8;
}

Assistant:

Result BinaryReaderInterp::OnCatchExpr(Index tag_index) {
  CHECK_RESULT(
      validator_.OnCatch(GetLocation(), Var(tag_index, GetLocation()), false));
  Label* label = TopLabel();
  HandlerDesc& desc = func_->handlers[label->handler_desc_index];
  desc.kind = HandlerKind::Catch;
  // Drop the previous block's exception if it was a catch.
  if (label->kind == LabelKind::Block) {
    istream_.EmitCatchDrop(1);
  }
  // Jump to the end of the block at the end of the previous try or catch.
  Istream::Offset offset = label->offset;
  istream_.Emit(Opcode::Br);
  assert(offset == Istream::kInvalidOffset);
  depth_fixups_.Append(label_stack_.size() - 1, istream_.end());
  istream_.Emit(offset);
  // The offset is only set after the first catch block, as the offset range
  // should only cover the try block itself.
  if (desc.try_end_offset == Istream::kInvalidOffset) {
    desc.try_end_offset = istream_.end();
  }
  // The label kind is switched to Block from Try in order to distinguish
  // catch blocks from try blocks. This is used to ensure that a try-delegate
  // inside this catch will not delegate to the catch, and instead find outer
  // try blocks to use as a delegate target.
  label->kind = LabelKind::Block;
  desc.catches.push_back(CatchDesc{tag_index, istream_.end()});
  return Result::Ok;
}